

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flash.h
# Opt level: O2

void __thiscall Flash::~Flash(Flash *this)

{
  this->_vptr_Flash = (_func_int **)&PTR__Flash_00117158;
  FlashOption<std::vector<bool,_std::allocator<bool>_>_>::~FlashOption(&this->_regions);
  WordCopyApplet::~WordCopyApplet(&this->_wordCopy);
  std::__cxx11::string::~string((string *)&this->_name);
  return;
}

Assistant:

virtual ~Flash() {}